

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerPagecount(Pager *pPager,Pgno *pnPage)

{
  Wal *pWVar1;
  sqlite3_file *psVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  i64 n;
  sqlite3_int64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = pPager->pWal;
  uVar4 = 0;
  if ((pWVar1 != (Wal *)0x0) && (-1 < pWVar1->readLock)) {
    uVar4 = (pWVar1->hdr).nPage;
  }
  if (uVar4 == 0) {
    psVar2 = pPager->fd;
    if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
      uVar4 = 0;
    }
    else {
      local_20 = 0;
      iVar3 = (*psVar2->pMethods->xFileSize)(psVar2,&local_20);
      if (iVar3 != 0) goto LAB_0013f36d;
      uVar4 = (uint)((local_20 + pPager->pageSize + -1) / pPager->pageSize);
    }
  }
  if (pPager->mxPgno < uVar4) {
    pPager->mxPgno = uVar4;
  }
  *pnPage = uVar4;
  iVar3 = 0;
LAB_0013f36d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int pagerPagecount(Pager *pPager, Pgno *pnPage){
  Pgno nPage;                     /* Value to return via *pnPage */

  /* Query the WAL sub-system for the database size. The WalDbsize()
  ** function returns zero if the WAL is not open (i.e. Pager.pWal==0), or
  ** if the database size is not available. The database size is not
  ** available from the WAL sub-system if the log file is empty or
  ** contains no valid committed transactions.
  */
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );
  assert( isOpen(pPager->fd) );
  assert( pPager->tempFile==0 );
  nPage = sqlite3WalDbsize(pPager->pWal);

  /* If the number of pages in the database is not available from the
  ** WAL sub-system, determine the page count based on the size of
  ** the database file.  If the size of the database file is not an
  ** integer multiple of the page-size, round up the result.
  */
  if( nPage==0 && ALWAYS(isOpen(pPager->fd)) ){
    i64 n = 0;                    /* Size of db file in bytes */
    int rc = sqlite3OsFileSize(pPager->fd, &n);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nPage = (Pgno)((n+pPager->pageSize-1) / pPager->pageSize);
  }

  /* If the current number of pages in the file is greater than the
  ** configured maximum pager number, increase the allowed limit so
  ** that the file can be read.
  */
  if( nPage>pPager->mxPgno ){
    pPager->mxPgno = (Pgno)nPage;
  }

  *pnPage = nPage;
  return SQLITE_OK;
}